

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::MultiUPCEANReader::decodePattern
          (Barcode *__return_storage_ptr__,MultiUPCEANReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  uint uVar2;
  int start;
  double dVar3;
  Iterator puVar4;
  Iterator puVar5;
  Iterator puVar6;
  PatternView begin_00;
  PatternView begin_01;
  PatternView begin_02;
  PatternView begin_03;
  BarcodeFormat format;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int i_1;
  long lVar12;
  int i;
  int i_00;
  anon_class_16_2_7a905435 isGuard;
  uint local_200;
  undefined1 local_1f8 [32];
  PatternView local_1d8;
  PartialResult res;
  PartialResult addOnRes;
  Error error;
  PatternView begin;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_94;
  undefined4 uStack_90;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [9];
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  isGuard.minQuietZone = 6.0;
  isGuard.pattern = (FixedPattern<3,_3,_false> *)param_3;
  FindLeftGuard<3,ZXing::FindLeftGuard<3,3,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<3,3,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&res,(ZXing *)next,(PatternView *)0x21,0x1a01e0,isGuard);
  next->_base = (Iterator)res.txt.field_2._M_allocated_capacity;
  next->_end = (Iterator)res.txt.field_2._8_8_;
  next->_data = (Iterator)res.txt._M_dataplus._M_p;
  *(size_type *)&next->_size = res.txt._M_string_length;
  bVar7 = PatternView::isValid(next);
  if (!bVar7) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  PartialResult::PartialResult(&res);
  puVar4 = next->_data;
  begin._size = next->_size;
  begin._12_4_ = *(undefined4 *)&next->field_0xc;
  puVar5 = next->_base;
  puVar6 = next->_end;
  uVar2 = (((this->super_RowReader)._opts)->_formats).i;
  begin._data = puVar4;
  begin._base = puVar5;
  begin._end = puVar6;
  if (uVar2 != 0 && (uVar2 & 0x4200) == 0) {
LAB_00174fd0:
    uVar2 = (((this->super_RowReader)._opts)->_formats).i;
    if (uVar2 == 0 || (uVar2 >> 8 & 1) != 0) {
      local_1d8._base = begin._base;
      local_1d8._end = begin._end;
      local_1d8._data = begin._data;
      local_1d8._size = begin._size;
      local_1d8._12_4_ = begin._12_4_;
      addOnRes.txt._M_dataplus._M_p = (pointer)(begin._data + 0x13);
      addOnRes.txt._M_string_length = CONCAT44(addOnRes.txt._M_string_length._4_4_,5);
      addOnRes.txt.field_2._M_local_buf[0] = (char)begin._base;
      addOnRes.txt.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)begin._base >> 8);
      addOnRes.txt.field_2._M_local_buf[8] = (char)begin._end;
      addOnRes.txt.field_2._9_4_ = (undefined4)((ulong)begin._end >> 8);
      addOnRes.txt.field_2._13_2_ = (undefined2)((ulong)begin._end >> 0x28);
      addOnRes.txt.field_2._M_local_buf[0xf] = (char)((ulong)begin._end >> 0x38);
      error._msg._M_dataplus._M_p = (pointer)(begin._data + 0x28);
      error._msg._M_string_length = CONCAT44(error._msg._M_string_length._4_4_,3);
      error._msg.field_2._M_allocated_capacity = (size_type)begin._base;
      error._msg.field_2._8_8_ = begin._end;
      bVar7 = PatternView::isValid((PatternView *)&error);
      if ((bVar7) &&
         (bVar7 = IsRightGuard<3,3,false>
                            ((PatternView *)&error,(FixedPattern<3,_3,_false> *)&END_PATTERN,3.0,0.0
                            ), bVar7)) {
        dVar3 = IsPattern<false,5,5>
                          ((PatternView *)&addOnRes,(FixedPattern<5,_5,_false> *)MID_PATTERN,0,0.0,
                           0.0);
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          iVar9 = PatternView::sum(&local_1d8,0);
          iVar11 = PatternView::sum((PatternView *)&addOnRes,0);
          iVar10 = PatternView::sum((PatternView *)&error,0);
          local_1f8._0_8_ = (Iterator)0x1800000003;
          for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 4) {
            start = *(int *)(local_1f8 + lVar12);
            i_00 = 0;
            while (i_00 != 4) {
              begin_00._size = local_1d8._size;
              begin_00._12_4_ = local_1d8._12_4_;
              begin_00._data = local_1d8._data;
              begin_00._base._0_4_ = (int)local_1d8._base;
              begin_00._base._4_4_ = (int)((ulong)local_1d8._base >> 0x20);
              begin_00._end = local_1d8._end;
              bVar7 = PlausibleDigitModuleSize
                                (begin_00,start,i_00,(float)(iVar11 + iVar9 + iVar10) / 11.0);
              i_00 = i_00 + 1;
              if (!bVar7) goto LAB_001751f6;
            }
          }
          local_1f8._0_8_ = local_1d8._data + 3;
          local_1f8._8_4_ = 4;
          res.txt._M_string_length = 0;
          local_1f8._16_8_ = local_1d8._base;
          local_1f8._24_8_ = local_1d8._end;
          *res.txt._M_dataplus._M_p = '\0';
          bVar7 = DecodeDigits(4,(PatternView *)local_1f8,&res.txt,(int *)0x0);
          if (bVar7) {
            local_1f8._0_8_ = local_1f8._0_8_ + 10;
            local_1f8._8_4_ = 4;
            bVar7 = DecodeDigits(4,(PatternView *)local_1f8,&res.txt,(int *)0x0);
            if (bVar7) {
              res.end._data = (Iterator)error._msg._M_dataplus._M_p;
              res.end._base._0_4_ = (undefined4)error._msg.field_2._M_allocated_capacity;
              res.end._base._4_4_ = (int)((ulong)error._msg.field_2._0_8_ >> 0x20);
              res.end._size = (int)error._msg._M_string_length;
              res.end._12_4_ = SUB84(error._msg._M_string_length >> 0x20,0);
              res.format = EAN8;
              goto LAB_00174fad;
            }
          }
        }
      }
    }
LAB_001751f6:
    iVar9 = (((this->super_RowReader)._opts)->_formats).i;
    if (iVar9 == 0 || (short)iVar9 < 0) {
      local_1f8._16_8_ = begin._base;
      local_1f8._24_8_ = begin._end;
      local_1f8._0_8_ = begin._data;
      local_1f8._8_8_ = begin._8_8_;
      addOnRes.txt._M_dataplus._M_p = (pointer)(begin._data + 0x1b);
      addOnRes.txt._M_string_length = CONCAT44(addOnRes.txt._M_string_length._4_4_,6);
      addOnRes.txt.field_2._M_local_buf[0] = (char)begin._base;
      addOnRes.txt.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)begin._base >> 8);
      addOnRes.txt.field_2._M_local_buf[8] = (char)begin._end;
      addOnRes.txt.field_2._9_4_ = (undefined4)((ulong)begin._end >> 8);
      addOnRes.txt.field_2._13_2_ = (undefined2)((ulong)begin._end >> 0x28);
      addOnRes.txt.field_2._M_local_buf[0xf] = (char)((ulong)begin._end >> 0x38);
      bVar7 = PatternView::isValid((PatternView *)&addOnRes);
      if ((bVar7) &&
         (bVar7 = IsRightGuard<6,6,false>
                            ((PatternView *)&addOnRes,(FixedPattern<6,_6,_false> *)UPCE_END_PATTERN,
                             6.0,0.0), bVar7)) {
        iVar9 = PatternView::sum((PatternView *)local_1f8,0);
        iVar10 = 0;
        iVar11 = PatternView::sum((PatternView *)&addOnRes,0);
        do {
          if (iVar10 == 6) {
            error._msg._M_dataplus._M_p = (pointer)(local_1f8._0_8_ + 6);
            error._msg._M_string_length = CONCAT44(error._msg._M_string_length._4_4_,4);
            error._msg.field_2._M_allocated_capacity = local_1f8._16_8_;
            error._msg.field_2._8_8_ = local_1f8._24_8_;
            local_1d8._data = (Iterator)((ulong)local_1d8._data & 0xffffffff00000000);
            std::__cxx11::string::assign((char *)&res);
            bVar7 = DecodeDigits(6,(PatternView *)&error,&res.txt,(int *)&local_1d8);
            if ((bVar7) &&
               (iVar9 = IndexOf<std::array<int,20ul>,int>
                                  ((array<int,_20UL> *)UPCEANCommon::NUMSYS_AND_CHECK_DIGIT_PATTERNS
                                   ,(int *)&local_1d8), iVar9 != -1)) {
              cVar8 = ToDigit<char>(iVar9 / 10);
              *res.txt._M_dataplus._M_p = cVar8;
              ToDigit<char>(iVar9 % 10);
              std::__cxx11::string::push_back((char)&res);
              res.end._end = (Iterator)
                             CONCAT17(addOnRes.txt.field_2._M_local_buf[0xf],
                                      CONCAT25(addOnRes.txt.field_2._13_2_,
                                               CONCAT41(addOnRes.txt.field_2._9_4_,
                                                        addOnRes.txt.field_2._M_local_buf[8])));
              res.end._base._0_4_ =
                   (undefined4)
                   CONCAT71(addOnRes.txt.field_2._M_allocated_capacity._1_7_,
                            addOnRes.txt.field_2._M_local_buf[0]);
              res.end._base._4_4_ = (int)((uint7)addOnRes.txt.field_2._1_7_ >> 0x18);
              res.end._data = (Iterator)addOnRes.txt._M_dataplus._M_p;
              res.end._size = (int)addOnRes.txt._M_string_length;
              res.end._12_4_ = SUB84(addOnRes.txt._M_string_length >> 0x20,0);
              res.format = UPCE;
              bVar7 = true;
              goto LAB_001753cc;
            }
            break;
          }
          begin_01._8_8_ = local_1f8._8_8_;
          begin_01._data = (Iterator)local_1f8._0_8_;
          begin_01._base._0_4_ = (int)local_1f8._16_8_;
          begin_01._base._4_4_ = SUB84(local_1f8._16_8_,4);
          begin_01._end = (Iterator)local_1f8._24_8_;
          bVar7 = PlausibleDigitModuleSize(begin_01,3,iVar10,(float)(iVar11 + iVar9) / 9.0);
          iVar10 = iVar10 + 1;
        } while (bVar7);
      }
    }
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    goto LAB_0017541d;
  }
  addOnRes.txt._M_dataplus._M_p = (pointer)(puVar4 + 0x1b);
  addOnRes.txt._M_string_length = CONCAT44(addOnRes.txt._M_string_length._4_4_,5);
  addOnRes.txt.field_2._M_local_buf[0] = (char)puVar5;
  addOnRes.txt.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)puVar5 >> 8);
  addOnRes.txt.field_2._M_local_buf[8] = (char)puVar6;
  addOnRes.txt.field_2._9_4_ = (undefined4)((ulong)puVar6 >> 8);
  addOnRes.txt.field_2._13_2_ = (undefined2)((ulong)puVar6 >> 0x28);
  addOnRes.txt.field_2._M_local_buf[0xf] = (char)((ulong)puVar6 >> 0x38);
  error._msg._M_dataplus._M_p = (pointer)(puVar4 + 0x38);
  error._msg._M_string_length = CONCAT44(error._msg._M_string_length._4_4_,3);
  error._msg.field_2._M_allocated_capacity = (size_type)puVar5;
  error._msg.field_2._8_8_ = puVar6;
  bVar7 = PatternView::isValid((PatternView *)&error);
  if ((!bVar7) ||
     (bVar7 = IsRightGuard<3,3,false>
                        ((PatternView *)&error,(FixedPattern<3,_3,_false> *)&END_PATTERN,3.0,0.0),
     !bVar7)) goto LAB_00174fd0;
  dVar3 = IsPattern<false,5,5>
                    ((PatternView *)&addOnRes,(FixedPattern<5,_5,_false> *)MID_PATTERN,0,0.0,0.0);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_00174fd0;
  local_1f8._0_8_ = puVar4 + 3;
  local_1f8._8_4_ = 4;
  local_1f8._16_8_ = puVar5;
  local_1f8._24_8_ = puVar6;
  std::__cxx11::string::assign((char *)&res);
  local_1d8._data = (Iterator)((ulong)local_1d8._data & 0xffffffff00000000);
  bVar7 = DecodeDigits(6,(PatternView *)local_1f8,&res.txt,(int *)&local_1d8);
  if (!bVar7) goto LAB_00174fd0;
  local_1f8._0_8_ = local_1f8._0_8_ + 10;
  local_1f8._8_4_ = 4;
  bVar7 = DecodeDigits(6,(PatternView *)local_1f8,&res.txt,(int *)0x0);
  if ((!bVar7) ||
     (iVar9 = IndexOf<int[10],int>((int (*) [10])FIRST_DIGIT_ENCODINGS,(int *)&local_1d8),
     iVar9 == -1)) goto LAB_00174fd0;
  cVar8 = ToDigit<char>(iVar9);
  *res.txt._M_dataplus._M_p = cVar8;
  res.end._base._0_4_ = (undefined4)error._msg.field_2._M_allocated_capacity;
  res.end._base._4_4_ = (int)((ulong)error._msg.field_2._0_8_ >> 0x20);
  res.end._data = (Iterator)error._msg._M_dataplus._M_p;
  res.end._size = (int)error._msg._M_string_length;
  res.end._12_4_ = SUB84(error._msg._M_string_length >> 0x20,0);
  res.format = EAN13;
LAB_00174fad:
  bVar7 = false;
  res.end._end = (Iterator)error._msg.field_2._8_8_;
LAB_001753cc:
  error._msg._M_dataplus._M_p = (pointer)&error._msg.field_2;
  error._msg._M_string_length = 0;
  error._msg.field_2._M_allocated_capacity =
       error._msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
  error._file = (char *)0x0;
  error._line = -1;
  error._type = None;
  if (bVar7) {
    UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::string>
              (&addOnRes.txt,(UPCEANCommon *)&res,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    std::__cxx11::string::string((string *)&addOnRes,(string *)&res);
  }
  bVar7 = GTIN::IsCheckDigitValid<char>(&addOnRes.txt);
  std::__cxx11::string::~string((string *)&addOnRes);
  if (!bVar7) {
    local_50 = local_40;
    addOnRes.txt._M_dataplus._M_p = (pointer)&addOnRes.txt.field_2;
    addOnRes.txt.field_2._M_local_buf[0] = '\0';
    addOnRes.txt.field_2._M_allocated_capacity._1_7_ = (undefined7)local_40._1_8_;
    addOnRes.txt.field_2._M_local_buf[8] = SUB81(local_40._1_8_,7);
    addOnRes.txt.field_2._9_4_ = local_37;
    addOnRes.txt.field_2._13_2_ = local_33;
    addOnRes.txt.field_2._M_local_buf[0xf] = local_31;
    addOnRes.txt._M_string_length = 0;
    local_48 = 0;
    local_40[0] = 0;
    addOnRes.end._data = (Iterator)anon_var_dwarf_1c340e;
    addOnRes.end._size._0_2_ = 0x11b;
    addOnRes.end._size._2_1_ = 2;
    Error::operator=(&error,(Error *)&addOnRes);
    std::__cxx11::string::~string((string *)&addOnRes);
    std::__cxx11::string::~string((string *)&local_50);
  }
  uVar2 = (((this->super_RowReader)._opts)->_formats).i;
  if (res.format == EAN13 && (uVar2 == 0 || (uVar2 >> 0xe & 1) != 0)) {
    if (*res.txt._M_dataplus._M_p == '0') {
      std::__cxx11::string::substr((ulong)&addOnRes,(ulong)&res);
      std::__cxx11::string::operator=((string *)&res,(string *)&addOnRes);
      std::__cxx11::string::~string((string *)&addOnRes);
      res.format = UPCA;
      local_200 = 0x30;
      goto LAB_001755c7;
    }
LAB_00175584:
    local_200 = 0x30;
    if ((uVar2 >> 9 & 1) != 0 || uVar2 == 0) goto LAB_001755c7;
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    if (res.format == EAN13) goto LAB_00175584;
    local_200 = (byte)((res.format == EAN8) << 2) | 0x30;
LAB_001755c7:
    puVar5 = res.end._end;
    iVar9 = res.end._size;
    puVar4 = res.end._data;
    next->_base = (Iterator)CONCAT44(res.end._base._4_4_,res.end._base._0_4_);
    next->_end = res.end._end;
    next->_data = res.end._data;
    *(ulong *)&next->_size = CONCAT44(res.end._12_4_,res.end._size);
    local_1d8._data = (Iterator)CONCAT44(res.end._base._0_4_,res.end._12_4_);
    local_1d8._size = res.end._base._4_4_;
    PartialResult::PartialResult(&addOnRes);
    uVar2 = local_200;
    if (puVar4 != (Iterator)0x0 && (((this->super_RowReader)._opts)->field_0x1 & 0x60) != 0) {
      lVar12 = (long)iVar9;
      puVar1 = puVar4 + lVar12;
      if (((puVar1 + lVar12 <= puVar5) &&
          (iVar11 = PatternView::sum(&begin,0), puVar1 + lVar12 + 1 <= puVar5)) &&
         ((int)(uint)*puVar1 <= (int)((double)iVar11 * 3.5))) {
        uStack_94 = SUB84(local_1d8._data,0);
        uStack_90 = (undefined4)((ulong)local_1d8._data >> 0x20);
        begin_02._12_4_ = uStack_94;
        begin_02._size = iVar9;
        begin_02._data = puVar1 + 1;
        begin_02._base._0_4_ = uStack_90;
        begin_02._base._4_4_ = local_1d8._size;
        begin_02._end = puVar5;
        bVar7 = AddOn(&addOnRes,begin_02,5);
        if (!bVar7) {
          uStack_b4 = SUB84(local_1d8._data,0);
          uStack_b0 = (undefined4)((ulong)local_1d8._data >> 0x20);
          begin_03._12_4_ = uStack_b4;
          begin_03._size = iVar9;
          begin_03._data = puVar1 + 1;
          begin_03._base._0_4_ = uStack_b0;
          begin_03._base._4_4_ = local_1d8._size;
          begin_03._end = puVar5;
          bVar7 = AddOn(&addOnRes,begin_03,2);
          if (!bVar7) goto LAB_001757c7;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8," ",&addOnRes.txt);
        std::__cxx11::string::append((string *)&res);
        std::__cxx11::string::~string((string *)local_1f8);
        next->_base = addOnRes.end._base;
        next->_end = addOnRes.end._end;
        next->_data = addOnRes.end._data;
        *(ulong *)&next->_size =
             CONCAT53(addOnRes.end._11_5_,
                      CONCAT12(addOnRes.end._size._2_1_,(undefined2)addOnRes.end._size));
        uVar2 = 0x33;
        if (res.format == EAN8) {
          uVar2 = local_200;
        }
      }
    }
LAB_001757c7:
    local_200 = uVar2;
    if ((((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x6000) ==
         (undefined1  [12])0x4000) && (addOnRes.format == None)) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      iVar9 = PatternView::pixelsInFront(&begin);
      iVar11 = PatternView::pixelsTillEnd(next);
      format = res.format;
      Error::Error(&local_80,&error);
      Result::Result(__return_storage_ptr__,&res.txt,rowNumber,iVar9,iVar11,format,
                     (SymbologyIdentifier)(local_200 << 8 | 0x45),&local_80,false);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)&addOnRes);
  }
  std::__cxx11::string::~string((string *)&error);
LAB_0017541d:
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

Barcode MultiUPCEANReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	const int minSize = 3 + 6*4 + 6; // UPC-E

	next = FindLeftGuard(next, minSize, END_PATTERN, QUIET_ZONE_LEFT);
	if (!next.isValid())
		return {};

	PartialResult res;
	auto begin = next;
	
	if (!(((_opts.hasFormat(BarcodeFormat::EAN13 | BarcodeFormat::UPCA)) && EAN13(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::EAN8) && EAN8(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::UPCE) && UPCE(res, begin))))
		return {};

	Error error;
	if (!GTIN::IsCheckDigitValid(res.format == BarcodeFormat::UPCE ? UPCEANCommon::ConvertUPCEtoUPCA(res.txt) : res.txt))
		error = ChecksumError();

	// If UPC-A was a requested format and we detected a EAN-13 code with a leading '0', then we drop the '0' and call it
	// a UPC-A code.
	// TODO: this is questionable
	if (_opts.hasFormat(BarcodeFormat::UPCA) && res.format == BarcodeFormat::EAN13 && res.txt.front() == '0') {
		res.txt = res.txt.substr(1);
		res.format = BarcodeFormat::UPCA;
	}

	// if we explicitly requested UPCA but not EAN13, don't return an EAN13 symbol
	if (res.format == BarcodeFormat::EAN13 && ! _opts.hasFormat(BarcodeFormat::EAN13))
		return {};

	// Symbology identifier modifiers ISO/IEC 15420:2009 Annex B Table B.1
	// ISO/IEC 15420:2009 (& GS1 General Specifications 5.1.3) states that the content for "]E0" should be 13 digits,
	// i.e. converted to EAN-13 if UPC-A/E, but not doing this here to maintain backward compatibility
	SymbologyIdentifier symbologyIdentifier = {'E', res.format == BarcodeFormat::EAN8 ? '4' : '0'};

	next = res.end;

	auto ext = res.end;
	PartialResult addOnRes;
	if (_opts.eanAddOnSymbol() != EanAddOnSymbol::Ignore && ext.skipSymbol() && ext.skipSingle(static_cast<int>(begin.sum() * 3.5))
		&& (AddOn(addOnRes, ext, 5) || AddOn(addOnRes, ext, 2))) {
		// ISO/IEC 15420:2009 states that the content for "]E3" should be 15 or 18 digits, i.e. converted to EAN-13
		// and extended with no separator, and that the content for "]E4" should be 8 digits, i.e. no add-on
		res.txt += " " + addOnRes.txt;
		next = addOnRes.end;

		if (res.format != BarcodeFormat::EAN8) // Keeping EAN-8 with add-on as "]E4"
			symbologyIdentifier.modifier = '3'; // Combined packet, EAN-13, UPC-A, UPC-E, with add-on
	}
	
	if (_opts.eanAddOnSymbol() == EanAddOnSymbol::Require && !addOnRes.isValid())
		return {};

	return Barcode(res.txt, rowNumber, begin.pixelsInFront(), next.pixelsTillEnd(), res.format, symbologyIdentifier, error);
}